

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftpserver.c
# Opt level: O0

void uss_realpath(SftpServer *srv,SftpReplyBuilder *reply,ptrlen path)

{
  char *__name;
  char *str;
  ptrlen name;
  char *outpath;
  char *inpath;
  UnixSftpServer *uss;
  SftpReplyBuilder *reply_local;
  SftpServer *srv_local;
  ptrlen path_local;
  
  __name = mkstr(path);
  str = realpath(__name,(char *)0x0);
  free(__name);
  if (str == (char *)0x0) {
    uss_error((UnixSftpServer *)(srv + -6),reply);
  }
  else {
    name = ptrlen_from_asciz(str);
    fxp_reply_simple_name(reply,name);
    free(str);
  }
  return;
}

Assistant:

static void uss_realpath(SftpServer *srv, SftpReplyBuilder *reply,
                         ptrlen path)
{
    UnixSftpServer *uss = container_of(srv, UnixSftpServer, srv);

    char *inpath = mkstr(path);
    char *outpath = realpath(inpath, NULL);
    free(inpath);

    if (!outpath) {
        uss_error(uss, reply);
    } else {
        fxp_reply_simple_name(reply, ptrlen_from_asciz(outpath));
        free(outpath);
    }
}